

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket_parser.h
# Opt level: O1

uint64_t websocket_consume(void *buffer,uint64_t len,void *udata,uint8_t require_masking)

{
  byte bVar1;
  fio_write_args_s options;
  undefined1 *target;
  uint64_t uVar2;
  char first;
  long lVar3;
  uint uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  char text;
  ulong __n;
  byte *msg;
  byte *pbVar7;
  ws_s *ws;
  uchar in_stack_ffffffffffffff48;
  uint64_t local_88;
  undefined8 local_80;
  byte local_38;
  undefined7 uStack_37;
  
  if (len < 2) {
    local_80 = 2;
  }
  else {
    bVar1 = *(byte *)((long)buffer + 1) >> 7;
    lVar3 = (ulong)bVar1 * 4;
    uVar4 = *(byte *)((long)buffer + 1) & 0x7f;
    local_88 = (uint64_t)uVar4;
    if (uVar4 == 0x7f) {
      if (9 < len) {
        if (*(byte *)((long)buffer + 2) < 0x40) {
          local_88 = (ulong)*(byte *)((long)buffer + 9) |
                     (ulong)*(byte *)((long)buffer + 7) << 0x10 |
                     (ulong)*(byte *)((long)buffer + 6) << 0x18 |
                     (ulong)*(byte *)((long)buffer + 5) << 0x20 |
                     (ulong)*(byte *)((long)buffer + 4) << 0x28 |
                     (ulong)*(byte *)((long)buffer + 3) << 0x30 |
                     (ulong)*(byte *)((long)buffer + 2) << 0x38 |
                     (ulong)*(byte *)((long)buffer + 8) << 8;
          local_80 = (ulong)bVar1 * 0x100 + lVar3 + 10;
        }
        else {
          local_88 = 0;
          local_80 = 0;
        }
        goto LAB_0015cd55;
      }
      local_80 = (ulong)bVar1 * 0x100 + lVar3 + 10;
    }
    else {
      if (uVar4 != 0x7e) {
        local_80 = (ulong)bVar1 * 0x100 + lVar3 + 2;
        goto LAB_0015cd55;
      }
      if (3 < len) {
        local_88 = (uint64_t)
                   (ushort)(*(ushort *)((long)buffer + 2) << 8 | *(ushort *)((long)buffer + 2) >> 8)
        ;
        local_80 = (ulong)bVar1 * 0x100 + lVar3 + 4;
        goto LAB_0015cd55;
      }
      local_80 = (ulong)bVar1 * 0x100 + lVar3 + 4;
    }
  }
  local_88 = 0;
LAB_0015cd55:
  if ((char)local_80 == '\0') {
    fio_close(*(intptr_t *)((long)udata + 0x30));
  }
  else {
    __n = len;
    pbVar7 = (byte *)buffer;
    if (len < (local_80 & 0xff) + local_88) {
      return len;
    }
    do {
      if (__n < (local_80 & 0xff) + local_88) {
        memmove(buffer,(void *)((long)buffer + (len - __n)),__n);
        return __n;
      }
      msg = pbVar7 + (local_80 & 0xff);
      if (local_80._1_1_ == '\0') {
        if ((require_masking != '\0') && (local_88 != 0)) {
          fio_close(*(intptr_t *)((long)udata + 0x30));
        }
      }
      else {
        websocket_xmask(msg,local_88,*(uint32_t *)(msg + -4));
      }
      switch(*pbVar7 & 0xf) {
      case 0:
        first = '\0';
        goto LAB_0015ce5c;
      case 1:
        first = '\x01';
        text = '\x01';
        goto LAB_0015ce5f;
      case 2:
        first = '\x01';
LAB_0015ce5c:
        text = '\0';
LAB_0015ce5f:
        websocket_on_unwrapped(udata,msg,local_88,first,*pbVar7 >> 7,text,in_stack_ffffffffffffff48)
        ;
        break;
      default:
        fio_close(*(intptr_t *)((long)udata + 0x30));
        break;
      case 9:
        target = (undefined1 *)malloc(local_88 + 0x10);
        if (*(char *)((long)udata + 0xb1) == '\0') {
          *target = 0x8a;
          uVar5 = (undefined1)local_88;
          if (local_88 < 0x7e) {
            target[1] = uVar5;
            memcpy(target + 2,msg,local_88);
            uVar2 = local_88 + 2;
          }
          else {
            uVar6 = (undefined1)(local_88 >> 8);
            if (local_88 < 0x10000) {
              target[1] = 0x7e;
              target[2] = uVar6;
              target[3] = uVar5;
              memcpy(target + 4,msg,local_88);
              uVar2 = local_88 + 4;
            }
            else {
              target[1] = 0x7f;
              target[2] = (char)(local_88 >> 0x38);
              target[3] = (char)(local_88 >> 0x30);
              target[4] = (char)(local_88 >> 0x28);
              target[5] = (char)(local_88 >> 0x20);
              target[6] = (char)(local_88 >> 0x18);
              target[7] = (char)(local_88 >> 0x10);
              target[8] = uVar6;
              target[9] = uVar5;
              memcpy(target + 10,msg,local_88);
              uVar2 = local_88 + 10;
            }
          }
        }
        else {
          uVar2 = websocket_client_wrap
                            (target,msg,local_88,'\n','\x01','\x01',in_stack_ffffffffffffff48);
        }
        in_stack_ffffffffffffff48 = (uchar)target;
        options.after.dealloc = (_func_void_void_ptr *)0x0;
        options.data.buffer = target;
        options.length = uVar2;
        options.offset = 0;
        options._32_8_ = CONCAT71(uStack_37,local_38) & 0xfffffffffffffff0;
        fio_write2_fn(*(intptr_t *)((long)udata + 0x30),options);
        local_38 = local_38 & 0xf0;
        break;
      case 10:
      }
      __n = __n - ((local_80 & 0xff) + local_88);
      if (__n != 0) {
        pbVar7 = pbVar7 + (local_80 & 0xff) + local_88;
        if (__n == 1) {
          local_80 = 2;
LAB_0015cfcf:
          local_88 = 0;
        }
        else {
          bVar1 = pbVar7[1] >> 7;
          lVar3 = (ulong)bVar1 * 4;
          uVar4 = pbVar7[1] & 0x7f;
          local_88 = (uint64_t)uVar4;
          if (uVar4 == 0x7f) {
            if (__n < 10) {
              local_80 = (ulong)bVar1 * 0x100 + lVar3 + 10;
              goto LAB_0015cfcf;
            }
            if (pbVar7[2] < 0x40) {
              local_88 = (ulong)pbVar7[9] |
                         (ulong)pbVar7[7] << 0x10 |
                         (ulong)pbVar7[6] << 0x18 |
                         (ulong)pbVar7[5] << 0x20 |
                         (ulong)pbVar7[4] << 0x28 |
                         (ulong)pbVar7[3] << 0x30 | (ulong)pbVar7[2] << 0x38 | (ulong)pbVar7[8] << 8
              ;
              local_80 = (ulong)bVar1 * 0x100 + lVar3 + 10;
            }
            else {
              local_88 = 0;
              local_80 = 0;
            }
          }
          else if (uVar4 == 0x7e) {
            if (__n < 4) {
              local_80 = (ulong)bVar1 * 0x100 + lVar3 + 4;
              goto LAB_0015cfcf;
            }
            local_88 = (uint64_t)
                       (ushort)(*(ushort *)(pbVar7 + 2) << 8 | *(ushort *)(pbVar7 + 2) >> 8);
            local_80 = (ulong)bVar1 * 0x100 + lVar3 + 4;
          }
          else {
            local_80 = (ulong)bVar1 * 0x100 + lVar3 + 2;
          }
        }
      }
    } while (__n != 0);
  }
  return 0;
}

Assistant:

static uint64_t websocket_consume(void *buffer, uint64_t len, void *udata,
                                  uint8_t require_masking) {
  volatile struct websocket_packet_info_s info =
      websocket_buffer_peek(buffer, len);
  if (!info.head_length) {
#if DEBUG
    fprintf(stderr, "ERROR: WebSocket protocol error - malicious header.\n");
#endif
    websocket_on_protocol_error(udata);
    return 0;
  }
  if (info.head_length + info.packet_length > len)
    return len;
  uint64_t reminder = len;
  uint8_t *pos = (uint8_t *)buffer;
  while (info.head_length + info.packet_length <= reminder) {
    /* parse head */
    void *payload = (void *)(pos + info.head_length);
    /* unmask? */
    if (info.masked) {
      /* masked */
      uint32_t mask; // = ((uint32_t *)payload)[-1];
      ((uint8_t *)(&mask))[0] = ((uint8_t *)(payload))[-4];
      ((uint8_t *)(&mask))[1] = ((uint8_t *)(payload))[-3];
      ((uint8_t *)(&mask))[2] = ((uint8_t *)(payload))[-2];
      ((uint8_t *)(&mask))[3] = ((uint8_t *)(payload))[-1];
      websocket_xmask(payload, info.packet_length, mask);
    } else if (require_masking && info.packet_length) {
#if DEBUG
      fprintf(stderr, "ERROR: WebSocket protocol error - unmasked data.\n");
#endif
      websocket_on_protocol_error(udata);
    }
    /* call callback */
    switch (pos[0] & 15) {
    case 0:
      /* continuation frame */
      websocket_on_unwrapped(udata, payload, info.packet_length, 0,
                             ((pos[0] >> 7) & 1), 0, ((pos[0] >> 4) & 7));
      break;
    case 1:
      /* text frame */
      websocket_on_unwrapped(udata, payload, info.packet_length, 1,
                             ((pos[0] >> 7) & 1), 1, ((pos[0] >> 4) & 7));
      break;
    case 2:
      /* data frame */
      websocket_on_unwrapped(udata, payload, info.packet_length, 1,
                             ((pos[0] >> 7) & 1), 0, ((pos[0] >> 4) & 7));
      break;
    case 8:
      /* close frame */
      websocket_on_protocol_close(udata);
      break;
    case 9:
      /* ping frame */
      websocket_on_protocol_ping(udata, payload, info.packet_length);
      break;
    case 10:
      /* pong frame */
      websocket_on_protocol_pong(udata, payload, info.packet_length);
      break;
    default:
#if DEBUG
      fprintf(stderr, "ERROR: WebSocket protocol error - unknown opcode %u\n",
              (unsigned int)(pos[0] & 15));
#endif
      websocket_on_protocol_error(udata);
    }
    /* step forward */
    reminder = reminder - (info.head_length + info.packet_length);
    if (!reminder)
      return 0;
    pos += info.head_length + info.packet_length;
    info = websocket_buffer_peek(pos, reminder);
  }
  /* reset buffer state - support pipelining */
  memmove(buffer, (uint8_t *)buffer + len - reminder, reminder);
  return reminder;
}